

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void opl_set_mute_mask(void *chip,UINT32 MuteMask)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar1 = _DAT_001769f0;
  lVar2 = (long)chip + 0xdd;
  lVar3 = 0;
  auVar6 = _DAT_001769e0;
  do {
    auVar5 = auVar6 ^ auVar1;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7ffffff7) {
      *(bool *)lVar2 = (MuteMask >> ((uint)lVar3 & 0x1f) & 1) != 0;
      *(bool *)(lVar2 + 0xc0) = (MuteMask >> ((uint)lVar3 + 1 & 0x1f) & 1) != 0;
    }
    lVar3 = lVar3 + 2;
    lVar4 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar4 + 2;
    lVar2 = lVar2 + 0x180;
  } while (lVar3 != 10);
  lVar2 = 0;
  auVar5 = _DAT_001769e0;
  do {
    auVar6 = auVar5 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffffa) {
      *(bool *)((long)chip + lVar2 + 0x6e0) = (MuteMask >> ((int)lVar2 + 9U & 0x1f) & 1) != 0;
      *(bool *)((long)chip + lVar2 + 0x6e1) = (MuteMask >> ((int)lVar2 + 10U & 0x1f) & 1) != 0;
    }
    lVar2 = lVar2 + 2;
    lVar3 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar3 + 2;
  } while (lVar2 != 6);
  return;
}

Assistant:

void opl_set_mute_mask(void *chip, UINT32 MuteMask)
{
	FM_OPL *opl = (FM_OPL *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 9; CurChn ++)
		opl->P_CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		opl->MuteSpc[CurChn] = (MuteMask >> (9 + CurChn)) & 0x01;
	
	return;
}